

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

void Gia_ObjCollectInternalCut(Gia_Man_t *p,int iRoot,Vec_Int_t *vLeaves)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  if (-1 < iRoot) {
    pVVar1 = p->vTtNums;
    iVar6 = pVVar1->nSize;
    if (iRoot < iVar6) {
      piVar2 = pVVar1->pArray;
      if (-1000000000 < piVar2[(uint)iRoot]) {
        __assert_fail("!Gia_ObjHasNumId(p, iRoot)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0x26a,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
      }
      if (p->nObjs <= iRoot) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar4 = (uint)*(undefined8 *)(p->pObjs + (uint)iRoot);
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iRoot))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0x26b,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
      }
      iVar5 = vLeaves->nSize;
      if (0 < iVar5) {
        piVar3 = vLeaves->pArray;
        iVar6 = 0;
        lVar7 = 0;
        do {
          lVar8 = (long)piVar3[lVar7];
          if ((lVar8 < 0) || (pVVar1->nSize <= piVar3[lVar7])) goto LAB_0023a21c;
          if (piVar2[lVar8] < -999999999) {
            piVar2[lVar8] = iVar6;
            iVar5 = vLeaves->nSize;
          }
          lVar7 = lVar7 + 1;
          iVar6 = iVar6 + -1;
        } while (lVar7 < iVar5);
        iVar6 = pVVar1->nSize;
      }
      if (iRoot < iVar6) {
        if (piVar2[(uint)iRoot] < -999999999) {
          pVVar1 = p->vTtNodes;
          pVVar1->nSize = 0;
          Vec_IntPush(pVVar1,-1);
          Gia_ObjCollectInternalCut_rec(p,iRoot);
          return;
        }
        __assert_fail("!Gia_ObjHasNumId(p, iRoot)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0x273,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
      }
    }
  }
LAB_0023a21c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ObjCollectInternalCut( Gia_Man_t * p, int iRoot, Vec_Int_t * vLeaves )
{
    int i, iObj;
    assert( !Gia_ObjHasNumId(p, iRoot) );
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iRoot)) );
    Vec_IntForEachEntry( vLeaves, iObj, i )
    {
        if ( Gia_ObjHasNumId(p, iObj) ) // if cuts have repeated variables, skip 
            continue;
        assert( !Gia_ObjHasNumId(p, iObj) );
        Gia_ObjSetNumId( p, iObj, -i );
    }
    assert( !Gia_ObjHasNumId(p, iRoot) ); // the root cannot be one of the leaves
    Vec_IntClear( p->vTtNodes );
    Vec_IntPush( p->vTtNodes, -1 );
    Gia_ObjCollectInternalCut_rec( p, iRoot );
}